

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerGLSL::fixup_type_alias(CompilerGLSL *this)

{
  ParsedIR *this_00;
  uint id;
  uint id_00;
  size_t sVar1;
  bool bVar2;
  SPIRType *type;
  SPIRType *pSVar3;
  TypedID<(spirv_cross::Types)0> *pTVar4;
  long lVar5;
  TypedID<(spirv_cross::Types)0> *pTVar6;
  LoopLock local_50;
  LoopLock local_48;
  TypedID<(spirv_cross::Types)0> *local_40;
  TypedID<(spirv_cross::Types)0> *local_38;
  
  this_00 = &(this->super_Compiler).ir;
  ParsedIR::create_loop_hard_lock(this_00);
  pTVar4 = (this->super_Compiler).ir.ids_for_type[1].
           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  pTVar6 = pTVar4 + (this->super_Compiler).ir.ids_for_type[1].
                    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  local_40 = pTVar6;
  do {
    if (pTVar4 == pTVar6) {
      ParsedIR::LoopLock::~LoopLock(&local_50);
      return;
    }
    id = pTVar4->id;
    if ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr[id].type ==
        TypeType) {
      type = ParsedIR::get<spirv_cross::SPIRType>(this_00,id);
      if ((type->type_alias).id != 0) {
        bVar2 = Compiler::has_decoration
                          (&this->super_Compiler,(ID)(type->super_IVariant).self.id,DecorationBlock)
        ;
        if (!bVar2) {
          bVar2 = Compiler::has_decoration
                            (&this->super_Compiler,(ID)(type->super_IVariant).self.id,
                             DecorationBufferBlock);
          if (!bVar2) {
            bVar2 = Compiler::type_is_block_like(&this->super_Compiler,type);
            if (!bVar2 || (type->super_IVariant).self.id != id) goto LAB_0023f435;
            ParsedIR::create_loop_hard_lock(this_00);
            local_38 = (this->super_Compiler).ir.ids_for_type[1].
                       super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
            sVar1 = (this->super_Compiler).ir.ids_for_type[1].
                    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
            for (lVar5 = 0; sVar1 << 2 != lVar5; lVar5 = lVar5 + 4) {
              id_00 = *(uint *)((long)&local_38->id + lVar5);
              if ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr[id_00].
                  type == TypeType) {
                pSVar3 = ParsedIR::get<spirv_cross::SPIRType>(this_00,id_00);
                if ((id_00 != id) && ((pSVar3->type_alias).id == (type->type_alias).id)) {
                  (pSVar3->type_alias).id = id;
                }
              }
            }
            ParsedIR::LoopLock::~LoopLock(&local_48);
            pSVar3 = Compiler::get<spirv_cross::SPIRType>
                               (&this->super_Compiler,(type->type_alias).id);
            (pSVar3->type_alias).id = id;
            pTVar6 = local_40;
          }
        }
        (type->type_alias).id = 0;
      }
    }
LAB_0023f435:
    pTVar4 = pTVar4 + 1;
  } while( true );
}

Assistant:

void CompilerGLSL::fixup_type_alias()
{
	// Due to how some backends work, the "master" type of type_alias must be a block-like type if it exists.
	ir.for_each_typed_id<SPIRType>([&](uint32_t self, SPIRType &type) {
		if (!type.type_alias)
			return;

		if (has_decoration(type.self, DecorationBlock) || has_decoration(type.self, DecorationBufferBlock))
		{
			// Top-level block types should never alias anything else.
			type.type_alias = 0;
		}
		else if (type_is_block_like(type) && type.self == ID(self))
		{
			// A block-like type is any type which contains Offset decoration, but not top-level blocks,
			// i.e. blocks which are placed inside buffers.
			// Become the master.
			ir.for_each_typed_id<SPIRType>([&](uint32_t other_id, SPIRType &other_type) {
				if (other_id == self)
					return;

				if (other_type.type_alias == type.type_alias)
					other_type.type_alias = self;
			});

			this->get<SPIRType>(type.type_alias).type_alias = self;
			type.type_alias = 0;
		}
	});
}